

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O2

FT_Error T1_Get_Multi_Master(T1_Face face,FT_Multi_Master *master)

{
  uint uVar1;
  PS_Blend pPVar2;
  undefined8 *puVar3;
  FT_Error FVar4;
  long lVar5;
  ulong uVar6;
  
  pPVar2 = face->blend;
  if (pPVar2 == (PS_Blend)0x0) {
    FVar4 = 6;
  }
  else {
    uVar1 = pPVar2->num_axis;
    master->num_axis = uVar1;
    master->num_designs = pPVar2->num_designs;
    FVar4 = 0;
    lVar5 = 0;
    for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
      *(FT_String **)((long)&master->axis[0].name + lVar5) = pPVar2->axis_names[uVar6];
      puVar3 = *(undefined8 **)((long)&pPVar2->design_map[0].design_points + lVar5);
      *(undefined8 *)((long)&master->axis[0].minimum + lVar5) = *puVar3;
      *(undefined8 *)((long)&master->axis[0].maximum + lVar5) =
           puVar3[(ulong)(&pPVar2->design_map[0].num_points)[lVar5] - 1];
      lVar5 = lVar5 + 0x18;
    }
  }
  return FVar4;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Get_Multi_Master( T1_Face           face,
                       FT_Multi_Master*  master )
  {
    PS_Blend  blend = face->blend;
    FT_UInt   n;
    FT_Error  error;


    error = FT_THROW( Invalid_Argument );

    if ( blend )
    {
      master->num_axis    = blend->num_axis;
      master->num_designs = blend->num_designs;

      for ( n = 0; n < blend->num_axis; n++ )
      {
        FT_MM_Axis*   axis = master->axis + n;
        PS_DesignMap  map = blend->design_map + n;


        axis->name    = blend->axis_names[n];
        axis->minimum = map->design_points[0];
        axis->maximum = map->design_points[map->num_points - 1];
      }

      error = FT_Err_Ok;
    }

    return error;
  }